

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

IPV6 * Network::Address::IPV6::queryNameServer
                 (IPV6 *__return_storage_ptr__,String *host,TimeOut *timeout)

{
  uchar **this;
  sockaddr *psVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  String local_d0;
  undefined1 local_c0 [8];
  String port;
  String local_a0 [2];
  String local_80;
  String local_70;
  addrinfo *local_60;
  addrinfo *res;
  addrinfo hints;
  TimeOut *timeout_local;
  String *host_local;
  IPV6 *result;
  
  iVar3 = Time::TimeOut::operator_cast_to_int(timeout);
  if (iVar3 < 1) {
    IPV6(__return_storage_ptr__,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0);
  }
  else {
    iVar3 = Time::TimeOut::operator_cast_to_int(timeout);
    if (iVar3 == 3000) {
      hints.ai_addr = (sockaddr *)0x0;
      hints.ai_canonname = (char *)0x0;
      hints.ai_socktype = 0;
      hints.ai_protocol = 0;
      hints.ai_addrlen = 0;
      hints._20_4_ = 0;
      hints.ai_flags = 0;
      hints.ai_family = 0;
      local_60 = (addrinfo *)0x0;
      res = (addrinfo *)0xa00000004;
      Bstrlib::String::String(&local_80,"]");
      Bstrlib::String::upToFirst(&local_70,host,SUB81(&local_80,0));
      pcVar5 = Bstrlib::String::operator_cast_to_char_(&local_70);
      iVar3 = getaddrinfo(pcVar5,(char *)0x0,(addrinfo *)&res,&local_60);
      Bstrlib::String::~String(&local_70);
      Bstrlib::String::~String(&local_80);
      if (iVar3 != 0) {
        res = (addrinfo *)((ulong)res & 0xffffffff00000000);
        this = &port.super_tagbstring.data;
        Bstrlib::String::String((String *)this,"]");
        Bstrlib::String::upToFirst(local_a0,host,SUB81(this,0));
        pcVar5 = Bstrlib::String::operator_cast_to_char_(local_a0);
        iVar3 = getaddrinfo(pcVar5,(char *)0x0,(addrinfo *)&res,&local_60);
        Bstrlib::String::~String(local_a0);
        Bstrlib::String::~String((String *)&port.super_tagbstring.data);
        if (iVar3 != 0) {
          IPV6(__return_storage_ptr__,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0);
          return __return_storage_ptr__;
        }
      }
      Bstrlib::String::String(&local_d0,"]");
      Bstrlib::String::fromFirst((String *)local_c0,host,SUB81(&local_d0,0));
      Bstrlib::String::~String(&local_d0);
      if (((local_60->ai_family == 10) && (*(short *)local_60->ai_addr->sa_data == 0)) &&
         (iVar3 = Bstrlib::String::getLength((String *)local_c0), iVar3 != 0)) {
        uVar4 = Bstrlib::String::operator_cast_to_unsigned_int((String *)local_c0);
        uVar2 = htons((uint16_t)uVar4);
        *(uint16_t *)local_60->ai_addr->sa_data = uVar2;
      }
      psVar1 = local_60->ai_addr;
      uVar2 = ntohs(*(uint16_t *)psVar1->sa_data);
      IPV6(__return_storage_ptr__,(uint8 *)(psVar1->sa_data + 6),uVar2);
      freeaddrinfo(local_60);
      Bstrlib::String::~String((String *)local_c0);
    }
    else {
      IPV6(__return_storage_ptr__,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0xffff,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IPV6 IPV6::queryNameServer(const String & host, const Time::TimeOut & timeout)
        {
            if (timeout <= 0) return IPV6();
#ifndef NEXIO
            if (timeout == DefaultTimeOut)
            {
                struct addrinfo hints = {0}, *res = 0;
                hints.ai_family = AF_INET6;
                hints.ai_flags = AI_NUMERICHOST;

                // First try without resolving the domain name
                if (getaddrinfo((const char*)host.upToFirst("]", true), NULL, &hints, &res) != 0)
                {
                    // Ok, then resolve
                    hints.ai_flags = 0;
                    if (getaddrinfo((const char*)host.upToFirst("]", true), NULL, &hints, &res) != 0)
                        return IPV6();
                }
                String port = host.fromFirst("]");
                if (res[0].ai_family == AF_INET6 && !((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port && port.getLength())
                    ((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port = htons((unsigned int)port);


                IPV6 result((const uint8*)((struct sockaddr_in6 *)res[0].ai_addr)->sin6_addr.s6_addr, (uint16)ntohs(((struct sockaddr_in6 *)res[0].ai_addr)->sin6_port));
                freeaddrinfo(res);
                return result;
            }
#endif
            // Not implemented yet with a timeout
            return IPV6();
        }